

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O3

ErrorNumber test_abstract(void)

{
  TA_ParamHolder *param;
  ErrorNumber EVar1;
  TA_RetCode TVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  TA_ParamHolder *paramHolder;
  TA_FuncHandle *handle;
  int local_24;
  TA_ParamHolder *local_20;
  TA_FuncHandle *local_18;
  
  puts("Testing Abstract interface");
  EVar1 = allocLib();
  if (EVar1 != TA_TEST_PASS) {
    return EVar1;
  }
  TVar2 = TA_GetFuncHandle("STOCH",&local_18);
  if (TVar2 != TA_SUCCESS) {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar2);
    return TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  TVar2 = TA_ParamHolderAlloc(local_18,&local_20);
  param = local_20;
  if (TVar2 != TA_SUCCESS) {
    printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar2);
    return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
  }
  TVar2 = TA_SetOptInputParamInteger(local_20,0,3);
  if ((((TVar2 == TA_SUCCESS) &&
       (TVar2 = TA_SetOptInputParamInteger(param,1,4), TVar2 == TA_SUCCESS)) &&
      (TVar2 = TA_SetOptInputParamInteger(param,2,0), TVar2 == TA_SUCCESS)) &&
     ((TVar2 = TA_SetOptInputParamInteger(param,3,4), TVar2 == TA_SUCCESS &&
      (TVar2 = TA_SetOptInputParamInteger(param,4,0), TVar2 == TA_SUCCESS)))) {
    TVar2 = TA_GetLookback(param,&local_24);
    if (TVar2 != TA_SUCCESS) {
      printf("TA_GetLookback failed [%d]\n",(ulong)TVar2);
      uVar4 = 0x260;
      goto LAB_0011deba;
    }
    if (local_24 != 8) {
      printf("TA_GetLookback failed [%d != 8]\n");
      uVar4 = 0x262;
      goto LAB_0011deba;
    }
    TVar2 = TA_SetOptInputParamInteger(param,3,3);
    if (TVar2 == TA_SUCCESS) {
      TVar2 = TA_GetLookback(param,&local_24);
      if (TVar2 == TA_SUCCESS) {
        if (local_24 == 7) {
          TVar2 = TA_ParamHolderFree(local_20);
          if (TVar2 != TA_SUCCESS) {
            printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar2);
            return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
          }
          EVar1 = freeLib();
          if (EVar1 != TA_TEST_PASS) {
            return EVar1;
          }
          EVar1 = allocLib();
          if (EVar1 != TA_TEST_PASS) {
            return EVar1;
          }
          EVar1 = test_default_calls();
          if (EVar1 == TA_TEST_PASS) {
            EVar1 = freeLib();
            if (EVar1 != TA_TEST_PASS) {
              return EVar1;
            }
            uVar5 = 0;
            pcVar3 = TA_FunctionDescriptionXML();
            do {
              if (pcVar3[uVar5] == '\0') {
                if (499 < uVar5) {
                  return TA_TEST_PASS;
                }
                puts("TA_FunctionDescriptionXML failed. Size too small.");
                return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 != 1000000);
            puts("TA_FunctionDescriptionXML failed. Size too large (missing null?).");
            return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
          }
          puts("TA-Abstract default call failed");
          return EVar1;
        }
        printf("TA_GetLookback failed [%d != 7]\n");
        uVar4 = 0x263;
      }
      else {
        printf("TA_GetLookback failed [%d]\n",(ulong)TVar2);
        uVar4 = 0x261;
      }
      goto LAB_0011deba;
    }
  }
  printf("TA_SetOptInputParamInteger call failed [%d]\n",(ulong)TVar2);
  uVar4 = 0x25d;
LAB_0011deba:
  printf("testLookback() failed [%d]\n",uVar4);
  TA_ParamHolderFree(local_20);
  return (ErrorNumber)uVar4;
}

Assistant:

ErrorNumber test_abstract( void )
{
   ErrorNumber retValue;
   TA_RetCode retCode;
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   int i;
   const char *xmlArray;

   printf( "Testing Abstract interface\n" );

   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify TA_GetLookback. */
   retCode = TA_GetFuncHandle( "STOCH", &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   retValue = testLookback(paramHolder);
   if( retValue != TA_SUCCESS )
   {
      printf( "testLookback() failed [%d]\n", retValue );
      TA_ParamHolderFree( paramHolder );
      return retValue;
   }

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Call all the TA functions through the abstract interface. */
   retValue = allocLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   retValue = test_default_calls();
   if( retValue != TA_TEST_PASS )
   {
      printf( "TA-Abstract default call failed\n" );
      return retValue;
   }

   retValue = freeLib();
   if( retValue != TA_TEST_PASS )
      return retValue;

   /* Verify that the TA_FunctionDescription is null terminated
    * and as at least 500 characters (less is guaranteed bad...)
    */
   xmlArray = TA_FunctionDescriptionXML();
   for( i=0; i < 1000000; i++ )
   {
      if( xmlArray[i] == 0x0 )
         break;
   }

   if( i < 500)
   {
      printf( "TA_FunctionDescriptionXML failed. Size too small.\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_SMALL;
   }

   if( i == 1000000 )
   {
      printf( "TA_FunctionDescriptionXML failed. Size too large (missing null?).\n" );
      return TA_ABS_TST_FAIL_FUNCTION_DESC_LARGE;
   }

   return TA_TEST_PASS; /* Succcess. */
}